

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

SFFile * ReadSF2(char *filename,FileReader *f)

{
  bool bVar1;
  DWORD DVar2;
  SFFile *this;
  undefined8 uVar3;
  CIOErr anon_var_0;
  CBadForm anon_var_0_1;
  CBadVer anon_var_0_2;
  DWORD local_30;
  DWORD local_2c;
  DWORD chunklen;
  DWORD filelen;
  SFFile *sf2;
  FileReader *f_local;
  char *filename_local;
  
  _chunklen = (SFFile *)0x0;
  sf2 = (SFFile *)f;
  f_local = (FileReader *)filename;
  DVar2 = read_id(f);
  if (DVar2 == 0x46464952) {
    local_2c = read_dword((FileReader *)sf2);
    DVar2 = read_id((FileReader *)sf2);
    if (DVar2 == 0x6b626673) {
      local_2c = local_2c - 4;
      check_list((FileReader *)sf2,0x4f464e49,local_2c,&local_30);
      this = (SFFile *)operator_new(0x90);
      FString::FString((FString *)&stack0xffffffffffffffb8,(char *)f_local);
      SFFile::SFFile(this,(FString *)&stack0xffffffffffffffb8);
      _chunklen = this;
      FString::~FString((FString *)&stack0xffffffffffffffb8);
      ParseINFO(_chunklen,(FileReader *)sf2,local_30);
      local_2c = (local_2c - local_30) - 8;
      check_list((FileReader *)sf2,0x61746473,local_2c,&local_30);
      ParseSdta(_chunklen,(FileReader *)sf2,local_30);
      check_list((FileReader *)sf2,0x61746470,local_2c,&local_30);
      ParsePdta(_chunklen,(FileReader *)sf2,local_30);
      bVar1 = SFFile::FinalStructureTest(_chunklen);
      if (!bVar1) {
        uVar3 = __cxa_allocate_exception(1);
        __cxa_throw(uVar3,&CBadForm::typeinfo,0);
      }
      SFFile::CheckBags(_chunklen);
      SFFile::TranslatePercussions(_chunklen);
      filename_local = (char *)_chunklen;
    }
    else {
      filename_local = (char *)0x0;
    }
  }
  else {
    filename_local = (char *)0x0;
  }
  return (SFFile *)filename_local;
}

Assistant:

SFFile *ReadSF2(const char *filename, FileReader *f)
{
	SFFile *sf2 = NULL;
	DWORD filelen;
	DWORD chunklen;

	try
	{
		// Read RIFF sfbk header
		if (read_id(f) != ID_RIFF)
		{
			return NULL;
		}
		filelen = read_dword(f);
		if (read_id(f) != ID_sfbk)
		{
			return NULL;
		}
		filelen -= 4;

		// First chunk must be an INFO LIST
		check_list(f, ID_INFO, filelen, chunklen);

		sf2 = new SFFile(filename);

		ParseINFO(sf2, f, chunklen);
		filelen -= chunklen + 8;

		// Second chunk must be a sdta LIST
		check_list(f, ID_sdta, filelen, chunklen);
		ParseSdta(sf2, f, chunklen);

		// Third chunk must be a pdta LIST
		check_list(f, ID_pdta, filelen, chunklen);
		ParsePdta(sf2, f, chunklen);

		// There should be no more chunks. If there are, we'll just ignore them rather than reject the file.
		if (!sf2->FinalStructureTest())
		{
			throw CBadForm();
		}

		sf2->CheckBags();
		sf2->TranslatePercussions();

		return sf2;
	}
	catch (CIOErr)
	{
		Printf("Error reading %s: %s\n", filename, strerror(errno));
	}
	catch (CBadForm)
	{
		Printf("%s is corrupted.\n", filename);
	}
	catch (CBadVer)
	{
		Printf("%s is not a SoundFont version 2 file.\n", filename);
	}
	if (sf2 != NULL)
	{
		delete sf2;
	}
	return NULL;
}